

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O3

bool __thiscall
jsoncons::
basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
::visit_begin_object
          (basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
           *this,semantic_tag param_1,ser_context *param_2,error_code *ec)

{
  int iVar1;
  pointer peVar2;
  uint in_EAX;
  undefined8 uStack_18;
  
  iVar1 = this->nesting_depth_;
  this->nesting_depth_ = iVar1 + 1;
  if (iVar1 < *(int *)((this->options_)._vptr_basic_json_encode_options[-3] + 0xd0 +
                      (long)&(this->options_)._vptr_basic_json_encode_options)) {
    peVar2 = (this->stack_).
             super__Vector_base<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uStack_18._0_4_ = in_EAX;
    if ((((this->stack_).
          super__Vector_base<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
          ._M_impl.super__Vector_impl_data._M_start != peVar2) && (peVar2[-1].type_ == array)) &&
       (peVar2[-1].count_ != 0)) {
      std::__cxx11::wstring::push_back((wchar_t)(this->sink_).buf_ptr);
    }
    uStack_18 = (ulong)(uint)uStack_18;
    std::
    vector<jsoncons::basic_compact_json_encoder<wchar_t,jsoncons::string_sink<std::__cxx11::wstring>,std::allocator<char>>::encoding_context,std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,jsoncons::string_sink<std::__cxx11::wstring>,std::allocator<char>>::encoding_context>>
    ::
    emplace_back<jsoncons::basic_compact_json_encoder<wchar_t,jsoncons::string_sink<std::__cxx11::wstring>,std::allocator<char>>::container_type>
              ((vector<jsoncons::basic_compact_json_encoder<wchar_t,jsoncons::string_sink<std::__cxx11::wstring>,std::allocator<char>>::encoding_context,std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,jsoncons::string_sink<std::__cxx11::wstring>,std::allocator<char>>::encoding_context>>
                *)&this->stack_,(container_type *)((long)&uStack_18 + 4));
    std::__cxx11::wstring::push_back((wchar_t)(this->sink_).buf_ptr);
  }
  else {
    std::error_code::operator=(ec,max_nesting_depth_exceeded);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_object(semantic_tag, const ser_context&, std::error_code& ec) final
        {
            if (JSONCONS_UNLIKELY(++nesting_depth_ > options_.max_nesting_depth()))
            {
                ec = json_errc::max_nesting_depth_exceeded;
                JSONCONS_VISITOR_RETURN;
            } 
            if (!stack_.empty() && stack_.back().is_array() && stack_.back().count() > 0)
            {
                sink_.push_back(',');
            }

            stack_.emplace_back(container_type::object);
            sink_.push_back('{');
            JSONCONS_VISITOR_RETURN;
        }